

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O3

bool __thiscall
MipsParser::parseRspScalarElement(MipsParser *this,Parser *parser,MipsRegisterValue *dest)

{
  Token *pTVar1;
  string local_68;
  long local_48;
  Identifier local_40;
  
  dest->type = RspScalarElement;
  pTVar1 = Tokenizer::nextToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
  if ((pTVar1->type != LBrack) ||
     (pTVar1 = Tokenizer::nextToken
                         ((parser->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer),
     pTVar1->type != Integer)) {
    return false;
  }
  if (*(__index_type *)
       ((long)&(pTVar1->value).
               super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
       + 0x20) == '\x01') {
    local_48 = *(long *)&(pTVar1->value).
                         super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         ._M_u;
    if (7 < local_48) {
      return false;
    }
    tinyformat::format<long>(&local_68,"%d",&local_48);
    Identifier::Identifier(&local_40,&local_68);
    std::__cxx11::string::operator=((string *)&dest->name,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._name._M_dataplus._M_p != &local_40._name.field_2) {
      operator_delete(local_40._name._M_dataplus._M_p,
                      local_40._name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (*(__index_type *)
         ((long)&(pTVar1->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) == '\x01') {
      dest->num = *(int *)&(pTVar1->value).
                           super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           ._M_u + 8;
      pTVar1 = Tokenizer::nextToken
                         ((parser->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
      return pTVar1->type == RBrack;
    }
  }
  __assert_fail("std::holds_alternative<int64_t>(value)",
                "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                ,0x59,"int64_t Token::intValue() const");
}

Assistant:

bool MipsParser::parseRspScalarElement(Parser& parser, MipsRegisterValue& dest)
{
	dest.type = MipsRegisterType::RspScalarElement;

	if (parser.nextToken().type != TokenType::LBrack)
		return false;

	const Token &token = parser.nextToken();

	if (token.type != TokenType::Integer || token.intValue() >= 8)
		return false;

	dest.name = Identifier(tfm::format("%d", token.intValue()));
	dest.num = (int)token.intValue() + 8;

	return parser.nextToken().type == TokenType::RBrack;
}